

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution1d.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution1D::forward(Deconvolution1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t _elemsize;
  int *piVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  long lVar11;
  Mat local_98;
  Option *local_38;
  
  iVar10 = bottom_blob->w;
  iVar1 = this->kernel_w;
  iVar2 = this->dilation_w;
  _elemsize = bottom_blob->elemsize;
  iVar3 = this->stride_w;
  iVar4 = this->output_pad_right;
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  lVar11 = 0x10;
  if ((((this->pad_left < 1) && (this->pad_right < 1)) && (this->output_w < 1)) &&
     (lVar11 = 8, &local_98 != top_blob)) {
    piVar5 = top_blob->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    local_98.data = top_blob->data;
    local_98.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_98.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_98.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_98.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_98.elempack = top_blob->elempack;
    local_98.allocator = top_blob->allocator;
    uVar6 = top_blob->dims;
    uVar7 = top_blob->w;
    uVar8 = top_blob->h;
    uVar9 = top_blob->d;
    local_98.c = top_blob->c;
    local_98.cstep = top_blob->cstep;
    local_98.dims = uVar6;
    local_98.w = uVar7;
    local_98.h = uVar8;
    local_98.d = uVar9;
    local_38 = opt;
  }
  Mat::create(&local_98,iVar4 + (iVar1 + -1) * iVar2 + (iVar10 + -1) * iVar3 + 1,this->num_output,
              _elemsize,*(Allocator **)(&opt->lightmode + lVar11));
  if ((local_98.data != (void *)0x0) && ((long)local_98.c * local_98.cstep != 0)) {
    deconvolution1d(bottom_blob,&local_98,&this->weight_data,&this->bias_data,this->kernel_w,
                    this->stride_w,this->dilation_w,this->activation_type,&this->activation_params,
                    (Option *)0xffffffffffffff9c);
    cut_padding(this,&local_98,top_blob,opt);
    if ((top_blob->data != (void *)0x0) && (iVar10 = 0, (long)top_blob->c * top_blob->cstep != 0))
    goto LAB_004ed280;
  }
  iVar10 = -100;
LAB_004ed280:
  piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        free(local_98.data);
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar10;
}

Assistant:

int Deconvolution1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution1d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}